

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall cs_impl::any::swap(any *this,any *obj,bool raw)

{
  string *str;
  byte in_DL;
  proxy **in_RSI;
  proxy **in_RDI;
  error *this_00;
  undefined1 local_39 [40];
  byte local_11;
  
  local_11 = in_DL & 1;
  if (((*in_RDI == (proxy *)0x0) || (*in_RSI == (proxy *)0x0)) || (local_11 == 0)) {
    std::swap<cs_impl::any::proxy*>(in_RDI,in_RSI);
  }
  else {
    if (((((*in_RDI)->is_rvalue & 1U) != 0) || (0 < (*in_RDI)->protect_level)) ||
       (0 < (*in_RSI)->protect_level)) {
      str = (string *)__cxa_allocate_exception(0x28);
      this_00 = (error *)local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_39 + 1),"E000J",(allocator *)this_00);
      cov::error::error(this_00,str);
      __cxa_throw(str,&cov::error::typeinfo,cov::error::~error);
    }
    std::swap<cs_impl::any::baseHolder*>(&(*in_RDI)->data,&(*in_RSI)->data);
  }
  return;
}

Assistant:

void swap(any &obj, bool raw = false)
		{
			if (this->mDat != nullptr && obj.mDat != nullptr && raw) {
				if (mDat->is_rvalue || this->mDat->protect_level > 0 || obj.mDat->protect_level > 0)
					throw cov::error("E000J");
				std::swap(this->mDat->data, obj.mDat->data);
			}
			else
				std::swap(this->mDat, obj.mDat);
		}